

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::SeekHead::Parse(SeekHead *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long in_RDI;
  ptrdiff_t count_;
  VoidElement *e_1;
  Entry *e;
  long status_1;
  longlong size_1;
  longlong id_1;
  longlong idpos;
  VoidElement *pVoidElement;
  Entry *pEntry;
  long status;
  longlong size;
  longlong id;
  longlong void_element_count;
  longlong entry_count;
  longlong stop;
  longlong pos;
  IMkvReader *pReader;
  longlong *in_stack_fffffffffffffed8;
  longlong *in_stack_fffffffffffffee0;
  Entry *in_stack_fffffffffffffee8;
  Entry *in_stack_fffffffffffffef0;
  Entry *in_stack_fffffffffffffef8;
  Entry *in_stack_ffffffffffffff00;
  ulong in_stack_ffffffffffffff08;
  Entry *in_stack_ffffffffffffff10;
  Entry *in_stack_ffffffffffffff18;
  long local_b8;
  long local_b0;
  long *local_a0;
  long local_98;
  long local_48;
  long local_40;
  ulong local_38;
  Entry *local_30;
  long local_20;
  
  local_20 = *(long *)(in_RDI + 8);
  lVar4 = *(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10);
  local_30 = (Entry *)0x0;
  local_38 = 0;
  while (local_20 < lVar4) {
    lVar5 = ParseElementHeader((IMkvReader *)in_stack_fffffffffffffef8,
                               &in_stack_fffffffffffffef0->id,(longlong)in_stack_fffffffffffffee8,
                               in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (lVar5 < 0) {
      return lVar5;
    }
    if (local_40 == 0x4dbb) {
      local_30 = (Entry *)((long)&local_30->id + 1);
      if (0x7fffffff < (long)local_30) {
        return -1;
      }
    }
    else if ((local_40 == 0xec) && (local_38 = local_38 + 1, 0x7fffffff < (long)local_38)) {
      return -1;
    }
    local_20 = local_48 + local_20;
    if (lVar4 < local_20) {
      return -2;
    }
  }
  if (local_20 != lVar4) {
    return -2;
  }
  if (0 < (long)local_30) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_30;
    in_stack_ffffffffffffff08 = SUB168(auVar1 * ZEXT816(0x20),0);
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
      in_stack_ffffffffffffff08 = 0xffffffffffffffff;
    }
    in_stack_ffffffffffffff00 = local_30;
    in_stack_ffffffffffffff10 =
         (Entry *)operator_new__(in_stack_ffffffffffffff08,(nothrow_t *)&std::nothrow);
    in_stack_ffffffffffffff18 = (Entry *)0x0;
    if ((in_stack_ffffffffffffff10 != (Entry *)0x0) &&
       (in_stack_ffffffffffffff18 = in_stack_ffffffffffffff10,
       in_stack_ffffffffffffff00 != (Entry *)0x0)) {
      in_stack_fffffffffffffef0 = in_stack_ffffffffffffff10 + (long)in_stack_ffffffffffffff00;
      in_stack_fffffffffffffef8 = in_stack_ffffffffffffff10;
      do {
        in_stack_fffffffffffffee8 = in_stack_fffffffffffffef8;
        Entry::Entry(in_stack_fffffffffffffee8);
        in_stack_fffffffffffffef8 = in_stack_fffffffffffffee8 + 1;
        in_stack_ffffffffffffff18 = in_stack_ffffffffffffff10;
      } while (in_stack_fffffffffffffef8 != in_stack_fffffffffffffef0);
    }
    *(Entry **)(in_RDI + 0x28) = in_stack_ffffffffffffff18;
    if (*(long *)(in_RDI + 0x28) == 0) {
      return -1;
    }
  }
  if (0 < (long)local_38) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_38;
    uVar6 = SUB168(auVar2 * ZEXT816(0x10),0);
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    in_stack_fffffffffffffed8 = (longlong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    in_stack_fffffffffffffee0 = (longlong *)0x0;
    if (in_stack_fffffffffffffed8 != (longlong *)0x0) {
      in_stack_fffffffffffffee0 = in_stack_fffffffffffffed8;
    }
    *(longlong **)(in_RDI + 0x38) = in_stack_fffffffffffffee0;
    if (*(long *)(in_RDI + 0x38) == 0) {
      return -1;
    }
  }
  local_98 = *(long *)(in_RDI + 0x28);
  local_a0 = *(long **)(in_RDI + 0x38);
  local_20 = *(long *)(in_RDI + 8);
  while( true ) {
    if (lVar4 <= local_20) {
      if (local_20 == lVar4) {
        *(int *)(in_RDI + 0x30) = (int)(local_98 - *(long *)(in_RDI + 0x28) >> 5);
        *(int *)(in_RDI + 0x40) = (int)((long)local_a0 - *(long *)(in_RDI + 0x38) >> 4);
        return 0;
      }
      return -2;
    }
    lVar5 = ParseElementHeader((IMkvReader *)in_stack_fffffffffffffef8,
                               &in_stack_fffffffffffffef0->id,(longlong)in_stack_fffffffffffffee8,
                               in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (lVar5 < 0) break;
    if ((local_b0 == 0x4dbb) && (0 < (long)local_30)) {
      bVar3 = ParseEntry((IMkvReader *)in_stack_ffffffffffffff18,(longlong)in_stack_ffffffffffffff10
                         ,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      if (bVar3) {
        *(long *)(local_98 + 0x10) = local_20;
        *(long *)(local_98 + 0x18) = local_b8;
        local_98 = local_98 + 0x20;
      }
    }
    else if ((local_b0 == 0xec) && (0 < (long)local_38)) {
      *local_a0 = local_20;
      local_a0[1] = local_b8;
      local_a0 = local_a0 + 2;
    }
    local_20 = local_b8 + local_20;
    if (lVar4 < local_20) {
      return -2;
    }
  }
  return lVar5;
}

Assistant:

long SeekHead::Parse() {
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;
  const long long stop = m_start + m_size;

  // first count the seek head entries

  long long entry_count = 0;
  long long void_element_count = 0;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek) {
      ++entry_count;
      if (entry_count > INT_MAX)
        return E_PARSE_FAILED;
    } else if (id == libwebm::kMkvVoid) {
      ++void_element_count;
      if (void_element_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload

    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (entry_count > 0) {
    m_entries = new (std::nothrow) Entry[static_cast<size_t>(entry_count)];

    if (m_entries == NULL)
      return -1;
  }

  if (void_element_count > 0) {
    m_void_elements =
        new (std::nothrow) VoidElement[static_cast<size_t>(void_element_count)];

    if (m_void_elements == NULL)
      return -1;
  }

  // now parse the entries and void elements

  Entry* pEntry = m_entries;
  VoidElement* pVoidElement = m_void_elements;

  pos = m_start;

  while (pos < stop) {
    const long long idpos = pos;

    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek && entry_count > 0) {
      if (ParseEntry(pReader, pos, size, pEntry)) {
        Entry& e = *pEntry++;

        e.element_start = idpos;
        e.element_size = (pos + size) - idpos;
      }
    } else if (id == libwebm::kMkvVoid && void_element_count > 0) {
      VoidElement& e = *pVoidElement++;

      e.element_start = idpos;
      e.element_size = (pos + size) - idpos;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  ptrdiff_t count_ = ptrdiff_t(pEntry - m_entries);
  assert(count_ >= 0);
  assert(static_cast<long long>(count_) <= entry_count);

  m_entry_count = static_cast<int>(count_);

  count_ = ptrdiff_t(pVoidElement - m_void_elements);
  assert(count_ >= 0);
  assert(static_cast<long long>(count_) <= void_element_count);

  m_void_element_count = static_cast<int>(count_);

  return 0;
}